

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void file_name_inc(char *file_name)

{
  char cVar1;
  int local_1c;
  int lens;
  int i;
  int change;
  char c;
  char *file_name_local;
  
  local_1c = s_len_trim(file_name);
  if (local_1c < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FILE_NAME_INC - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input file name is blank.\n");
    exit(1);
  }
  lens = 0;
  while( true ) {
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) {
        if (lens == 0) {
          strcpy(file_name," ");
        }
        return;
      }
      cVar1 = file_name[local_1c];
    } while ((cVar1 < '0') || ('9' < cVar1));
    lens = lens + 1;
    if (cVar1 != '9') break;
    file_name[local_1c] = '0';
  }
  file_name[local_1c] = cVar1 + '\x01';
  return;
}

Assistant:

void file_name_inc ( char *file_name )

//****************************************************************************80
//
//  Purpose:
//
//    FILE_NAME_INC increments a partially numeric file name.
//
//  Discussion:
//
//    It is assumed that the digits in the name, whether scattered or
//    connected, represent a number that is to be increased by 1 on
//    each call.  If this number is all 9's on input, the output number
//    is all 0's.  Non-numeric letters of the name are unaffected.
//
//    If the input string contains no digits, a blank string is returned.
//
//    If a blank string is input, then an error condition results.
//
//  Example:
//
//      Input            Output
//      -----            ------
//      "a7to11.txt"     "a7to12.txt"  (typical case.  Last digit incremented)
//      "a7to99.txt"     "a8to00.txt"  (last digit incremented, with carry.)
//      "a9to99.txt"     "a0to00.txt"  (wrap around)
//      "cat.txt"        " "           (no digits to increment)
//      " "              STOP!         (error)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 September 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, character *FILE_NAME, (a pointer to) the character string
//    to be incremented.
//
{
  char c;
  int change;
  int i;
  int lens;

  lens = s_len_trim ( file_name );

  if ( lens <= 0 )
  {
    std::cerr << "\n";
    std::cerr << "FILE_NAME_INC - Fatal error!\n";
    std::cerr << "  Input file name is blank.\n";
    exit ( 1 );
  }

  change = 0;

  for ( i = lens-1; 0 <= i; i-- )
  {
    c = *(file_name+i);

    if ( '0' <= c && c <= '9' )
    {
      change = change + 1;
      if ( c == '9' )
      {
        c = '0';
        *(file_name+i) = c;
      }
      else
      {
        c = c + 1;
        *(file_name+i) = c;
        return;
      }
    }
  }

  if ( change == 0 )
  {
    strcpy ( file_name, " " );
  }

  return;
}